

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void __thiscall
testing::internal::
FieldMatcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::FieldMatcher(FieldMatcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this,string *field_name,
              offset_in_Record_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              field,Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *matcher)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *local_28;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *matcher_local;
  offset_in_Record_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> field_local;
  string *field_name_local;
  FieldMatcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  this->field_ = field;
  local_28 = matcher;
  matcher_local =
       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        *)field;
  field_local = (offset_in_Record_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                 )field_name;
  field_name_local = (string *)this;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher(&this->matcher_,matcher);
  std::operator+(&local_48,"whose field `",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field_local);
  std::operator+(&this->whose_field_,&local_48,"` ");
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

FieldMatcher(const std::string& field_name, FieldType Class::*field,
               const Matcher<const FieldType&>& matcher)
      : field_(field),
        matcher_(matcher),
        whose_field_("whose field `" + field_name + "` ") {}